

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonIO.hh
# Opt level: O0

void __thiscall avro::json::JsonGenerator::escape(JsonGenerator *this,char c,char *b,char *p)

{
  void *in_RCX;
  int in_EDX;
  void *__buf;
  void *__buf_00;
  byte in_SIL;
  JsonGenerator *in_RDI;
  
  write(in_RDI,in_EDX,in_RCX,(size_t)in_RCX);
  StreamWriter::write(&in_RDI->out_,0x5c,__buf,(size_t)in_RCX);
  StreamWriter::write(&in_RDI->out_,(uint)in_SIL,__buf_00,(size_t)in_RCX);
  return;
}

Assistant:

void escape(char c, const char* b, const char *p) {
        write(b, p);
        out_.write('\\');
        out_.write(c);
    }